

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_getBasis(void *highs,HighsInt *col_status,HighsInt *row_status)

{
  HighsBasis *pHVar1;
  size_type sVar2;
  const_reference pvVar3;
  long in_RDX;
  long in_RSI;
  Highs *in_RDI;
  size_t i_1;
  size_t i;
  HighsBasis *basis;
  ulong local_30;
  ulong local_28;
  
  pHVar1 = Highs::getBasis(in_RDI);
  local_28 = 0;
  while( true ) {
    sVar2 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::size
                      (&pHVar1->col_status);
    if (sVar2 <= local_28) break;
    pvVar3 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                       (&pHVar1->col_status,local_28);
    *(uint *)(in_RSI + local_28 * 4) = (uint)*pvVar3;
    local_28 = local_28 + 1;
  }
  local_30 = 0;
  while( true ) {
    sVar2 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::size
                      (&pHVar1->row_status);
    if (sVar2 <= local_30) break;
    pvVar3 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                       (&pHVar1->row_status,local_30);
    *(uint *)(in_RDX + local_30 * 4) = (uint)*pvVar3;
    local_30 = local_30 + 1;
  }
  return 0;
}

Assistant:

HighsInt Highs_getBasis(const void* highs, HighsInt* col_status,
                        HighsInt* row_status) {
  const HighsBasis& basis = ((Highs*)highs)->getBasis();
  for (size_t i = 0; i < basis.col_status.size(); i++) {
    col_status[i] = static_cast<HighsInt>(basis.col_status[i]);
  }

  for (size_t i = 0; i < basis.row_status.size(); i++) {
    row_status[i] = static_cast<HighsInt>(basis.row_status[i]);
  }
  return kHighsStatusOk;
}